

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void test_then_block(LexState *ls,int *escapelist)

{
  FuncState *fs;
  int list;
  int l2;
  
  fs = ls->fs;
  luaX_next(ls);
  list = cond(ls);
  checknext(ls,0x112);
  block(ls);
  if ((ls->t).token - 0x103U < 2) {
    l2 = luaK_jump(fs);
    luaK_concat(fs,escapelist,l2);
  }
  luaK_patchtohere(fs,list);
  return;
}

Assistant:

static void test_then_block (LexState *ls, int *escapelist) {
  /* test_then_block -> [IF | ELSEIF] cond THEN block */
  FuncState *fs = ls->fs;
  int condtrue;
  luaX_next(ls);  /* skip IF or ELSEIF */
  condtrue = cond(ls);  /* read condition */
  checknext(ls, TK_THEN);
  block(ls);  /* 'then' part */
  if (ls->t.token == TK_ELSE ||
      ls->t.token == TK_ELSEIF)  /* followed by 'else'/'elseif'? */
    luaK_concat(fs, escapelist, luaK_jump(fs));  /* must jump over it */
  luaK_patchtohere(fs, condtrue);
}